

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>
::_reduce_column(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>
                 *this,Index target,Index eventIndex)

{
  Index IVar1;
  uint uVar2;
  Dimension dim;
  Column *this_00;
  reference pvVar3;
  bool bVar4;
  Index local_30;
  uint local_2c;
  Index currIndex;
  ID_index pivot;
  Column *curr;
  anon_class_8_1_8991fb9c get_column_with_pivot_;
  Index eventIndex_local;
  Index target_local;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>
  *this_local;
  
  curr = (Column *)this;
  get_column_with_pivot_.this._0_4_ = eventIndex;
  get_column_with_pivot_.this._4_4_ = target;
  this_00 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>
            ::get_column(&this->reducedMatrixR_,target);
  local_2c = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>
             ::get_pivot(this_00);
  local_30 = _reduce_column::anon_class_8_1_8991fb9c::operator()
                       ((anon_class_8_1_8991fb9c *)&curr,local_2c);
  while( true ) {
    uVar2 = Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>
            ::get_null_value<unsigned_int>();
    bVar4 = false;
    if (local_2c != uVar2) {
      uVar2 = Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>
              ::get_null_value<unsigned_int>();
      bVar4 = local_30 != uVar2;
    }
    if (!bVar4) break;
    _reduce_column_by(this,get_column_with_pivot_.this._4_4_,local_30);
    local_2c = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>_>
               ::get_pivot(this_00);
    local_30 = _reduce_column::anon_class_8_1_8991fb9c::operator()
                         ((anon_class_8_1_8991fb9c *)&curr,local_2c);
  }
  uVar2 = Matrix<RU_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false,_true,_false,_true>_>
          ::get_null_value<unsigned_int>();
  IVar1 = get_column_with_pivot_.this._4_4_;
  if (local_2c == uVar2) {
    dim = get_column_dimension(this,get_column_with_pivot_.this._4_4_);
    _add_bar(this,dim,(Index)get_column_with_pivot_.this);
  }
  else {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->pivotToColumnIndex_,(ulong)local_2c);
    *pvVar3 = IVar1;
    _update_barcode(this,local_2c,(Index)get_column_with_pivot_.this);
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce_column(Index target, Index eventIndex)
{
  auto get_column_with_pivot_ = [&](ID_index pivot) -> Index {
    if (pivot == Master_matrix::template get_null_value<ID_index>())
      return Master_matrix::template get_null_value<Index>();
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      auto it = pivotToColumnIndex_.find(pivot);
      if (it == pivotToColumnIndex_.end())
        return Master_matrix::template get_null_value<Index>();
      else
        return it->second;
    } else {
      return pivotToColumnIndex_[pivot];
    }
  };

  Column& curr = reducedMatrixR_.get_column(target);
  ID_index pivot = curr.get_pivot();
  Index currIndex = get_column_with_pivot_(pivot);

  while (pivot != Master_matrix::template get_null_value<ID_index>() &&
         currIndex != Master_matrix::template get_null_value<Index>()) {
    _reduce_column_by(target, currIndex);
    pivot = curr.get_pivot();
    currIndex = get_column_with_pivot_(pivot);
  }

  if (pivot != Master_matrix::template get_null_value<ID_index>()) {
    if constexpr (Master_matrix::Option_list::has_map_column_container) {
      pivotToColumnIndex_.try_emplace(pivot, target);
    } else {
      pivotToColumnIndex_[pivot] = target;
    }
    _update_barcode(pivot, eventIndex);
  } else {
    _add_bar(get_column_dimension(target), eventIndex);
  }
}